

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

void __thiscall TcpServerImpl::Delete(TcpServerImpl *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  
  piVar5 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar5) {
    do {
      close(*piVar5);
      piVar2 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar1 = piVar2 + 1;
      if (piVar1 != piVar3) {
        memmove(piVar2,piVar1,(long)piVar3 - (long)piVar1);
      }
      piVar5 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
      (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar6;
    } while (piVar6 != piVar5);
  }
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mtAcceptList);
  if (iVar4 == 0) {
    piVar5 = (this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar5) {
      do {
        shutdown(*piVar5,2);
        close(*(this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
        piVar2 = (this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar1 = piVar2 + 1;
        if (piVar1 != piVar3) {
          memmove(piVar2,piVar1,(long)piVar3 - (long)piVar1);
        }
        piVar5 = (this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
        (this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar6;
      } while (piVar6 != piVar5);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mtAcceptList);
    return;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void TcpServerImpl::Delete()
{
    while (m_vSock.size())
    {
        ::closesocket(m_vSock[0]);
        m_vSock.erase(begin(m_vSock));
    }

    lock_guard<mutex> lock(m_mtAcceptList);
    while (m_vSockAccept.size())
    {
        ::shutdown(m_vSockAccept[0], SD_BOTH);
        ::closesocket(m_vSockAccept[0]);
        m_vSockAccept.erase(begin(m_vSockAccept));
    }
}